

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::GetNode
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,int key)

{
  TValueTraits<FUDMFKeys> local_29;
  Node *pNStack_28;
  TValueTraits<FUDMFKeys> traits;
  Node *n;
  int key_local;
  TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this_local;
  
  pNStack_28 = FindKey(this,key);
  this_local = (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *)pNStack_28;
  if (pNStack_28 == (Node *)0x0) {
    pNStack_28 = NewKey(this,key);
    TValueTraits<FUDMFKeys>::Init(&local_29,&(pNStack_28->Pair).Value);
    this_local = (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *)pNStack_28;
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}